

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshUtilities.cpp
# Opt level: O3

void Rml::MeshUtilities::GenerateBackground
               (Mesh *out_mesh,RenderBox *render_box,ColourbPremultiplied color)

{
  Vector2f inner_size;
  GeometryBackgroundBorder geometry;
  BorderMetrics metrics;
  GeometryBackgroundBorder GStack_c8;
  BorderMetrics local_b8;
  
  if (((0xffffff < (uint)color) && (inner_size = render_box->fill_size, 0.0 < inner_size.x)) &&
     (0.0 < inner_size.y)) {
    GeometryBackgroundBorder::ComputeBorderMetrics
              (&local_b8,render_box->border_offset,(EdgeSizes)*&(render_box->border_widths)._M_elems
               ,inner_size,(CornerSizes)*&(render_box->border_radius)._M_elems);
    ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
              (&out_mesh->vertices,
               (long)((int)((ulong)((long)(out_mesh->vertices).
                                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(out_mesh->vertices).
                                         super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x33333333 + 4));
    ::std::vector<int,_std::allocator<int>_>::reserve
              (&out_mesh->indices,
               ((long)(out_mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(out_mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) * 0x40000000 + 0x600000000 >> 0x20);
    GeometryBackgroundBorder::GeometryBackgroundBorder
              (&GStack_c8,&out_mesh->vertices,&out_mesh->indices);
    GeometryBackgroundBorder::DrawBackground(&GStack_c8,&local_b8,color);
  }
  return;
}

Assistant:

void MeshUtilities::GenerateBackground(Mesh& out_mesh, const RenderBox& render_box, ColourbPremultiplied color)
{
	const Vector2f fill_size = render_box.GetFillSize();
	const bool has_background = (color.alpha > 0 && fill_size.x > 0 && fill_size.y > 0);
	if (!has_background)
		return;

	const BorderMetrics metrics = GeometryBackgroundBorder::ComputeBorderMetrics(render_box.GetBorderOffset(), render_box.GetBorderWidths(),
		fill_size, render_box.GetBorderRadius());

	Vector<Vertex>& vertices = out_mesh.vertices;
	Vector<int>& indices = out_mesh.indices;

	// Reserve geometry. A conservative estimate, does not take border-radii into account.
	vertices.reserve((int)vertices.size() + 4);
	indices.reserve((int)indices.size() + 6);

	// Generate the geometry
	GeometryBackgroundBorder geometry(vertices, indices);
	geometry.DrawBackground(metrics, color);
}